

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

uint32_t motion_estimation(AV1_COMP *cpi,MACROBLOCK *x,uint8_t *cur_frame_buf,uint8_t *ref_frame_buf
                          ,int stride,int ref_stride,int width,int ref_width,BLOCK_SIZE bsize,
                          MV center_mv,int_mv *best_mv)

{
  MV MVar1;
  uint8_t *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  AV1_COMP *in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  undefined4 in_stack_00000008;
  int in_stack_00000010;
  FULLPEL_MV *in_stack_00000028;
  MV subpel_start_mv;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  search_site_config *search_site_cfg;
  FULLPEL_MV start_mv;
  int cost_list [5];
  uint32_t sse;
  int distortion;
  FULLPEL_MV_STATS best_mv_stats;
  uint32_t bestsme;
  int step_param;
  TPL_SPEED_FEATURES *tpl_sf;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  int local_230;
  int *in_stack_fffffffffffffdd8;
  MV *in_stack_fffffffffffffde0;
  BLOCK_SIZE in_stack_fffffffffffffdef;
  MACROBLOCK *in_stack_fffffffffffffdf0;
  AV1_COMP *in_stack_fffffffffffffdf8;
  SUBPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffe00;
  MV *in_stack_fffffffffffffe28;
  BLOCK_SIZE in_stack_fffffffffffffe37;
  SUBPEL_SEARCH_TYPE in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe39;
  AV1_COMP *in_stack_fffffffffffffe40;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffe48;
  FULLPEL_MV in_stack_fffffffffffffe54;
  search_site_config *in_stack_fffffffffffffe60;
  SEARCH_METHODS in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe70;
  FULLPEL_MV_STATS *in_stack_ffffffffffffff18;
  FULLPEL_MV *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff34;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_ffffffffffffff38;
  FULLPEL_MV in_stack_ffffffffffffff40;
  FULLPEL_MV *in_stack_ffffffffffffff50;
  int local_88 [7];
  uint local_6c;
  int local_68;
  FULLPEL_MV_STATS local_64;
  uint32_t local_58;
  int local_54;
  TPL_SPEED_FEATURES *local_50;
  MACROBLOCKD *local_48;
  AV1_COMMON *local_40;
  int local_38;
  undefined4 local_34;
  uint8_t *local_30;
  undefined8 local_28;
  long local_20;
  AV1_COMP *local_18;
  uint32_t local_c;
  
  local_40 = &in_RDI->common;
  local_48 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  local_50 = &(in_RDI->sf).tpl_sf;
  local_58 = 0xffffffff;
  local_38 = in_R9D;
  local_34 = in_R8D;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  get_fullmv_from_mv((MV *)&stack0x00000020);
  *(undefined8 *)(local_20 + 0x30) = local_28;
  *(undefined4 *)(local_20 + 0x48) = local_34;
  *(undefined4 *)(local_20 + 0x40) = in_stack_00000008;
  local_48->plane[0].pre[0].buf = local_30;
  local_48->plane[0].pre[0].stride = local_38;
  local_48->plane[0].pre[0].width = in_stack_00000010;
  local_230 = local_50->reduce_first_step_size;
  if (8 < local_230) {
    local_230 = 9;
  }
  local_54 = local_230;
  av1_make_default_fullpel_ms_params
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             (MACROBLOCK *)CONCAT71(in_stack_fffffffffffffe39,in_stack_fffffffffffffe38),
             in_stack_fffffffffffffe37,in_stack_fffffffffffffe28,in_stack_fffffffffffffe54,
             in_stack_fffffffffffffe60,in_stack_fffffffffffffe68,in_stack_fffffffffffffe70);
  cond_cost_list(local_18,local_88);
  local_58 = av1_full_pixel_search
                       (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                        in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,
                        in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                        in_stack_ffffffffffffff50);
  if (local_50->subpel_force_stop == '\x03') {
    MVar1 = get_mv_from_fullmv(in_stack_00000028);
    in_stack_00000028->row = MVar1.row;
    in_stack_00000028->col = MVar1.col;
    local_c = local_58;
  }
  else {
    av1_make_default_subpel_ms_params
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
               in_stack_fffffffffffffdef,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    local_64.err_cost = 0;
    MVar1 = get_mv_from_fullmv(in_stack_00000028);
    local_c = (*(local_18->mv_search_params).find_fractional_mv_step)
                        (local_48,local_40,(SUBPEL_MOTION_SEARCH_PARAMS *)&stack0xfffffffffffffdd8,
                         MVar1,&local_64,(MV *)in_stack_00000028,&local_68,&local_6c,(int_mv *)0x0);
  }
  return local_c;
}

Assistant:

static uint32_t motion_estimation(AV1_COMP *cpi, MACROBLOCK *x,
                                  uint8_t *cur_frame_buf,
                                  uint8_t *ref_frame_buf, int stride,
                                  int ref_stride, int width, int ref_width,
                                  BLOCK_SIZE bsize, MV center_mv,
                                  int_mv *best_mv) {
  AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  TPL_SPEED_FEATURES *tpl_sf = &cpi->sf.tpl_sf;
  int step_param;
  uint32_t bestsme = UINT_MAX;
  FULLPEL_MV_STATS best_mv_stats;
  int distortion;
  uint32_t sse;
  int cost_list[5];
  FULLPEL_MV start_mv = get_fullmv_from_mv(&center_mv);

  // Setup frame pointers
  x->plane[0].src.buf = cur_frame_buf;
  x->plane[0].src.stride = stride;
  x->plane[0].src.width = width;
  xd->plane[0].pre[0].buf = ref_frame_buf;
  xd->plane[0].pre[0].stride = ref_stride;
  xd->plane[0].pre[0].width = ref_width;

  step_param = tpl_sf->reduce_first_step_size;
  step_param = AOMMIN(step_param, MAX_MVSEARCH_STEPS - 2);

  const search_site_config *search_site_cfg =
      cpi->mv_search_params.search_site_cfg[SS_CFG_SRC];
  if (search_site_cfg->stride != ref_stride)
    search_site_cfg = cpi->mv_search_params.search_site_cfg[SS_CFG_LOOKAHEAD];
  assert(search_site_cfg->stride == ref_stride);

  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  av1_make_default_fullpel_ms_params(&full_ms_params, cpi, x, bsize, &center_mv,
                                     start_mv, search_site_cfg,
                                     tpl_sf->search_method,
                                     /*fine_search_interval=*/0);

  bestsme = av1_full_pixel_search(start_mv, &full_ms_params, step_param,
                                  cond_cost_list(cpi, cost_list),
                                  &best_mv->as_fullmv, &best_mv_stats, NULL);

  // When sub-pel motion search is skipped, populate sub-pel precision MV and
  // return.
  if (tpl_sf->subpel_force_stop == FULL_PEL) {
    best_mv->as_mv = get_mv_from_fullmv(&best_mv->as_fullmv);
    return bestsme;
  }

  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize, &center_mv,
                                    cost_list);
  ms_params.forced_stop = tpl_sf->subpel_force_stop;
  ms_params.var_params.subpel_search_type = USE_2_TAPS;
  ms_params.mv_cost_params.mv_cost_type = MV_COST_NONE;
  best_mv_stats.err_cost = 0;
  MV subpel_start_mv = get_mv_from_fullmv(&best_mv->as_fullmv);
  assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, subpel_start_mv));
  bestsme = cpi->mv_search_params.find_fractional_mv_step(
      xd, cm, &ms_params, subpel_start_mv, &best_mv_stats, &best_mv->as_mv,
      &distortion, &sse, NULL);

  return bestsme;
}